

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O1

void __thiscall
crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::convert_to_grayscale
          (image<crnlib::color_quad<unsigned_char,_int>_> *this)

{
  color_quad<unsigned_char,_int> *pcVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uchar uVar5;
  
  if (this->m_height != 0) {
    uVar2 = 0;
    do {
      if (this->m_width != 0) {
        uVar3 = 0;
        do {
          pcVar1 = this->m_pPixels;
          uVar4 = this->m_pitch * uVar2 + uVar3;
          uVar5 = (uchar)((uint)pcVar1[uVar4].field_0.field_0.b * 0x1d2f +
                          (uint)pcVar1[uVar4].field_0.field_0.g * 0x9646 +
                          (uint)pcVar1[uVar4].field_0.field_0.r * 0x4c8b + 0x8000 >> 0x10);
          pcVar1[uVar4].field_0.field_0.r = uVar5;
          pcVar1[uVar4].field_0.field_0.g = uVar5;
          pcVar1[uVar4].field_0.field_0.b = uVar5;
          uVar3 = uVar3 + 1;
        } while (uVar3 < this->m_width);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->m_height);
  }
  *(byte *)&this->m_comp_flags = (byte)this->m_comp_flags | 0x10;
  return;
}

Assistant:

void convert_to_grayscale()
        {
            for (uint y = 0; y < m_height; y++)
            {
                for (uint x = 0; x < m_width; x++)
                {
                    color_type c((*this)(x, y));
                    typename color_type::component_t l = static_cast<typename color_type::component_t>(c.get_luma());
                    c.r = l;
                    c.g = l;
                    c.b = l;
                    (*this)(x, y) = c;
                }
            }

            set_grayscale(true);
        }